

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O0

void MyCompiler::Util::processAst<MyCompiler::Block>
               (Block *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  element_type *ast_00;
  element_type *ast_01;
  vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_> *this;
  reference ast_02;
  element_type *ast_03;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  reference local_c8;
  ProcedureDeclaration *subAst;
  iterator __end2;
  iterator __begin2;
  vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
  *__range2;
  string local_a0 [39];
  allocator local_79;
  string local_78 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *name_local;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *items_local;
  Block *pBStack_10;
  int level_local;
  Block *ast_local;
  
  local_28 = name;
  name_local = (string *)items;
  items_local._4_4_ = level;
  pBStack_10 = ast;
  std::operator+(local_48,(char *)name);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,(int *)((long)&items_local + 4),local_48);
  std::__cxx11::string::~string((string *)local_48);
  bVar2 = std::operator!=(&pBStack_10->pConstDeclaration,(nullptr_t)0x0);
  if (bVar2) {
    ast_00 = std::
             __shared_ptr_access<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pBStack_10->pConstDeclaration);
    psVar1 = name_local;
    iVar3 = items_local._4_4_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"const-declaration",&local_79);
    processAst<MyCompiler::ConstDeclaration>
              (ast_00,iVar3,
               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)psVar1,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  bVar2 = std::operator!=(&pBStack_10->pVarDeclaration,(nullptr_t)0x0);
  if (bVar2) {
    ast_01 = std::
             __shared_ptr_access<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pBStack_10->pVarDeclaration);
    psVar1 = name_local;
    iVar3 = items_local._4_4_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"var-declaration",(allocator *)((long)&__range2 + 7));
    processAst<MyCompiler::VarDeclaration>
              (ast_01,iVar3,
               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)psVar1,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  bVar2 = std::
          vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
          ::empty(&pBStack_10->vProcedureDeclaration);
  if (!bVar2) {
    __range2._0_4_ = items_local._4_4_ + 1;
    std::
    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
    ::emplace_back<int,char_const(&)[24]>
              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                *)name_local,(int *)&__range2,(char (*) [24])"procedure-declarations:");
    this = &pBStack_10->vProcedureDeclaration;
    __end2 = std::
             vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
             ::begin(this);
    subAst = (ProcedureDeclaration *)
             std::
             vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
             ::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<MyCompiler::ProcedureDeclaration_*,_std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>_>
                                       *)&subAst), bVar2) {
      ast_02 = __gnu_cxx::
               __normal_iterator<MyCompiler::ProcedureDeclaration_*,_std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>_>
               ::operator*(&__end2);
      psVar1 = name_local;
      iVar3 = items_local._4_4_ + 2;
      local_c8 = ast_02;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"",&local_e9);
      processAst<MyCompiler::ProcedureDeclaration>
                (ast_02,iVar3,
                 (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)psVar1,(string *)local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      __gnu_cxx::
      __normal_iterator<MyCompiler::ProcedureDeclaration_*,_std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>_>
      ::operator++(&__end2);
    }
  }
  ast_03 = std::__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&pBStack_10->pStatement);
  psVar1 = name_local;
  iVar3 = items_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"",&local_111);
  processAst<MyCompiler::Statement>
            (ast_03,iVar3,
             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)psVar1,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::Block>(
        Block &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, name + ":");
    if (ast.pConstDeclaration != nullptr)
        processAst(*ast.pConstDeclaration, level + 1, items, "const-declaration");
    if (ast.pVarDeclaration != nullptr)
        processAst(*ast.pVarDeclaration, level + 1, items, "var-declaration");
    if (!ast.vProcedureDeclaration.empty())
    {
        items.emplace_back(level + 1, "procedure-declarations:");
        for (ProcedureDeclaration &subAst : ast.vProcedureDeclaration)
            processAst(subAst, level + 2, items, "");
    }
    processAst(*ast.pStatement, level + 1, items, "");
}